

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void instantiate_children
               (ecs_world_t *world,ecs_entity_t base,ecs_table_t *table,ecs_data_t *data,int32_t row
               ,int32_t count,ecs_table_t *child_table)

{
  short sVar1;
  ecs_vector_t *peVar2;
  ecs_entity_t base_00;
  ecs_entity_t data_00;
  ecs_table_t *peVar3;
  void **component_data;
  int16_t offset;
  int32_t iVar4;
  ecs_data_t *data_01;
  void *pvVar5;
  void **ppvVar6;
  void *pvVar7;
  int iVar8;
  bool bVar9;
  void *pvStack_100;
  int local_f4;
  ecs_vector_t *local_f0;
  int local_e4;
  ecs_entity_t local_e0;
  ecs_entity_t child_1;
  ecs_data_t *i_data;
  ecs_table_t *peStack_c8;
  int32_t child_row;
  ecs_entity_t child;
  ecs_entity_t *children;
  ecs_table_t *peStack_b0;
  int j;
  ecs_table_t *i_table;
  ecs_entity_t instance;
  void *pvStack_98;
  int32_t child_count;
  ecs_entity_t *entities;
  ecs_column_t *column;
  ecs_entity_t c;
  int local_78;
  int pos;
  int base_index;
  int i;
  void **c_info;
  ecs_entities_t components;
  int32_t type_count;
  ecs_entity_t *type_array;
  int32_t column_count;
  ecs_data_t *child_data;
  ecs_type_t type;
  int32_t count_local;
  int32_t row_local;
  ecs_data_t *data_local;
  ecs_table_t *table_local;
  ecs_entity_t base_local;
  ecs_world_t *world_local;
  
  peVar2 = child_table->type;
  pvStack_100 = (void *)0x11a32b;
  data_01 = ecs_table_get_data(child_table);
  if (data_01 != (ecs_data_t *)0x0) {
    pvStack_100 = (void *)0x11a33f;
    iVar4 = ecs_table_data_count(data_01);
    if (iVar4 != 0) {
      iVar8 = child_table->column_count;
      pvStack_100 = (void *)0x11a366;
      pvVar5 = _ecs_vector_first(peVar2,8,0x10);
      pvStack_100 = (void *)0x11a373;
      components._12_4_ = ecs_vector_count(peVar2);
      c_info = (void **)(&stack0xffffffffffffff08 +
                        -((long)(int)(components._12_4_ << 3) + 0x10U & 0xfffffffffffffff0));
      components.array._0_4_ = 0;
      ppvVar6 = (void **)((long)c_info - ((long)(iVar8 << 3) + 0xfU & 0xfffffffffffffff0));
      local_78 = -1;
      c._4_4_ = 0;
      _base_index = ppvVar6;
      for (pos = 0; pos < (int)components._12_4_; pos = pos + 1) {
        column = *(ecs_column_t **)((long)pvVar5 + (long)pos * 8);
        if (column != (ecs_column_t *)0x101) {
          if ((((ulong)column & 0xff00000000000000) == 0xfd00000000000000) &&
             (((ulong)column & 0xffffffffffffff) == base)) {
            local_78 = c._4_4_;
          }
          if (pos < iVar8) {
            entities = (ecs_entity_t *)(data_01->columns + pos);
            peVar2 = ((ecs_column_t *)entities)->data;
            sVar1 = ((ecs_column_t *)entities)->size;
            if (((ecs_column_t *)entities)->alignment < 0x10) {
              local_f4 = 0x10;
            }
            else {
              local_f4 = (int)((ecs_column_t *)entities)->alignment;
            }
            offset = (int16_t)local_f4;
            local_f0 = peVar2;
            local_e4 = (int)sVar1;
            ppvVar6[-1] = (void *)0x11a4c5;
            pvVar7 = _ecs_vector_first(peVar2,(int)sVar1,offset);
            _base_index[c._4_4_] = pvVar7;
          }
          c_info[c._4_4_] = column;
          c._4_4_ = c._4_4_ + 1;
        }
      }
      bVar9 = local_78 != -1;
      ppvVar6[-1] = (void *)0x11a52a;
      _ecs_assert(bVar9,0xc,(char *)0x0,"base_index != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x20c);
      if (local_78 == -1) {
        ppvVar6[-1] = (void *)0x11a551;
        __assert_fail("base_index != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x20c,
                      "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                     );
      }
      if ((table->flags & 2) != 0) {
        c_info[c._4_4_] = (void *)0x101;
        c._4_4_ = c._4_4_ + 1;
      }
      components.array._0_4_ = c._4_4_;
      peVar2 = data->entities;
      ppvVar6[-1] = (void *)0x11a595;
      pvStack_98 = _ecs_vector_first(peVar2,8,0x10);
      peVar2 = data_01->entities;
      ppvVar6[-1] = (void *)0x11a5a8;
      instance._4_4_ = ecs_vector_count(peVar2);
      for (pos = row; pos < count + row; pos = pos + 1) {
        i_table = *(ecs_table_t **)((long)pvStack_98 + (long)pos * 8);
        c_info[local_78] = (void *)((ulong)i_table | 0xfd00000000000000);
        ppvVar6[-1] = (void *)0x11a605;
        peStack_b0 = ecs_table_find_or_create(world,(ecs_entities_t *)&c_info);
        bVar9 = peStack_b0 != (ecs_table_t *)0x0;
        ppvVar6[-1] = (void *)0x11a63f;
        _ecs_assert(bVar9,0xc,(char *)0x0,"i_table != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x222);
        if (peStack_b0 == (ecs_table_t *)0x0) {
          ppvVar6[-1] = (void *)0x11a66a;
          __assert_fail("i_table != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x222,
                        "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                       );
        }
        peVar2 = data_01->entities;
        ppvVar6[-1] = (void *)0x11a680;
        child = (ecs_entity_t)_ecs_vector_first(peVar2,8,0x10);
        for (children._4_4_ = 0; component_data = _base_index, iVar8 = instance._4_4_,
            peVar3 = peStack_b0, children._4_4_ < instance._4_4_;
            children._4_4_ = children._4_4_ + 1) {
          peStack_c8 = *(ecs_table_t **)(child + (long)children._4_4_ * 8);
          bVar9 = peStack_c8 != i_table;
          ppvVar6[-1] = (void *)0x11a6f5;
          _ecs_assert(bVar9,2,(char *)0x0,"child != instance",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x22d);
          if (peStack_c8 == i_table) {
            ppvVar6[-1] = (void *)0x11a726;
            __assert_fail("child != instance",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                          ,0x22d,
                          "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                         );
          }
        }
        ppvVar6[-1] = (void *)0x11a761;
        new_w_data(world,peVar3,(ecs_entities_t *)0x0,iVar8,component_data,
                   (int32_t *)((long)&i_data + 4));
        peVar3 = peStack_b0;
        ppvVar6[-1] = (void *)0x11a76d;
        child_1 = (ecs_entity_t)ecs_table_get_data(peVar3);
        for (children._4_4_ = 0; peVar3 = peStack_b0, data_00 = child_1,
            children._4_4_ < instance._4_4_; children._4_4_ = children._4_4_ + 1) {
          base_00 = *(ecs_entity_t *)(child + (long)children._4_4_ * 8);
          iVar8 = i_data._4_4_ + children._4_4_;
          local_e0 = base_00;
          ppvVar6[-1] = (void *)0x11a7d7;
          instantiate(world,base_00,peVar3,(ecs_data_t *)data_00,iVar8,1);
        }
      }
    }
  }
  return;
}

Assistant:

static
void instantiate_children(
    ecs_world_t * world,
    ecs_entity_t base,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,
    ecs_table_t * child_table)
{
    ecs_type_t type = child_table->type;
    ecs_data_t *child_data = ecs_table_get_data(child_table);
    if (!child_data || !ecs_table_data_count(child_data)) {
        return;
    }

    int32_t column_count = child_table->column_count;
    ecs_entity_t *type_array = ecs_vector_first(type, ecs_entity_t);
    int32_t type_count = ecs_vector_count(type);   

    /* Instantiate child table for each instance */

    /* Create component array for creating the table */
    ecs_entities_t components = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * type_count + 1)
    };

    void **c_info = ecs_os_alloca(ECS_SIZEOF(void*) * column_count);

    /* Copy in component identifiers. Find the base index in the component
     * array, since we'll need this to replace the base with the instance id */
    int i, base_index = -1, pos = 0;

    for (i = 0; i < type_count; i ++) {
        ecs_entity_t c = type_array[i];
        
        /* Make sure instances don't have EcsPrefab */
        if (c == EcsPrefab) {
            continue;
        }

        /* Keep track of the element that creates the CHILDOF relationship with
        * the prefab parent. We need to replace this element to make sure the
        * created children point to the instance and not the prefab */ 
        if (ECS_HAS_ROLE(c, CHILDOF) && (c & ECS_COMPONENT_MASK) == base) {
            base_index = pos;
        }        

        /* Store pointer to component array. We'll use this component array to
        * create our new entities in bulk with new_w_data */
        if (i < column_count) {
            ecs_column_t *column = &child_data->columns[i];
            c_info[pos] = ecs_vector_first_t(
                column->data, column->size, column->alignment);
        }

        components.array[pos] = c;
        pos ++;
    }

    ecs_assert(base_index != -1, ECS_INTERNAL_ERROR, NULL);

    /* If children are added to a prefab, make sure they are prefabs too */
    if (table->flags & EcsTableIsPrefab) {
        components.array[pos] = EcsPrefab;
        pos ++;
    }

    components.count = pos;

    /* Instantiate the prefab child table for each new instance */
    ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);
    int32_t child_count = ecs_vector_count(child_data->entities);

    for (i = row; i < count + row; i ++) {
        ecs_entity_t instance = entities[i];

        /* Replace CHILDOF element in the component array with instance id */
        components.array[base_index] = ECS_CHILDOF | instance;

        /* Find or create table */
        ecs_table_t *i_table = ecs_table_find_or_create(world, &components);
        ecs_assert(i_table != NULL, ECS_INTERNAL_ERROR, NULL); 

        /* The instance is trying to instantiate from a base that is also
         * its parent. This would cause the hierarchy to instantiate itself
         * which would cause infinite recursion. */
        int j;
        ecs_entity_t *children = ecs_vector_first(
            child_data->entities, ecs_entity_t);
#ifndef NDEBUG
        for (j = 0; j < child_count; j ++) {
            ecs_entity_t child = children[j];        
            ecs_assert(child != instance, ECS_INVALID_PARAMETER, NULL);
        }
#endif

        /* Create children */
        int32_t child_row; 
        new_w_data(world, i_table, NULL, child_count, c_info, &child_row);       

        /* If prefab child table has children itself, recursively instantiate */
        ecs_data_t *i_data = ecs_table_get_data(i_table);
        for (j = 0; j < child_count; j ++) {
            ecs_entity_t child = children[j];
            instantiate(world, child, i_table, i_data, child_row + j, 1);
        }
    }       
}